

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package.cpp
# Opt level: O0

int32_t __thiscall icu_63::Package::findItem(Package *this,char *name,int32_t length)

{
  int iVar1;
  bool bVar2;
  int local_34;
  int local_30;
  int result;
  int32_t limit;
  int32_t start;
  int32_t i;
  int32_t length_local;
  char *name_local;
  Package *this_local;
  
  result = 0;
  limit = this->itemCount;
  while( true ) {
    local_30 = limit;
    if (local_30 <= result) {
      return result ^ 0xffffffff;
    }
    limit = (result + local_30) / 2;
    if (length < 0) {
      local_34 = strcmp(name,this->items[limit].name);
    }
    else {
      local_34 = strncmp(name,this->items[limit].name,(long)length);
    }
    if (local_34 == 0) break;
    if (-1 < local_34) {
      result = limit + 1;
      limit = local_30;
    }
  }
  if (-1 < length) {
    while( true ) {
      bVar2 = false;
      if (0 < limit) {
        iVar1 = strncmp(name,this->items[limit + -1].name,(long)length);
        bVar2 = iVar1 == 0;
      }
      if (!bVar2) break;
      limit = limit + -1;
    }
  }
  return limit;
}

Assistant:

int32_t
Package::findItem(const char *name, int32_t length) const {
    int32_t i, start, limit;
    int result;

    /* do a binary search for the string */
    start=0;
    limit=itemCount;
    while(start<limit) {
        i=(start+limit)/2;
        if(length>=0) {
            result=strncmp(name, items[i].name, length);
        } else {
            result=strcmp(name, items[i].name);
        }

        if(result==0) {
            /* found */
            if(length>=0) {
                /*
                 * if we compared just prefixes, then we may need to back up
                 * to the first item with this prefix
                 */
                while(i>0 && 0==strncmp(name, items[i-1].name, length)) {
                    --i;
                }
            }
            return i;
        } else if(result<0) {
            limit=i;
        } else /* result>0 */ {
            start=i+1;
        }
    }

    return ~start; /* not found, return binary-not of the insertion point */
}